

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_7::Validator::CheckVar
          (Validator *this,Index max_index,Var *var,char *desc,Index *out_index)

{
  Enum EVar1;
  
  if (var->type_ == Index) {
    if ((var->field_2).index_ < max_index) {
      EVar1 = Ok;
      if (out_index != (Index *)0x0) {
        *out_index = (var->field_2).index_;
        EVar1 = Ok;
      }
    }
    else {
      PrintError(this,&var->loc,"%s variable out of range (max %u)",desc,max_index);
      EVar1 = Error;
    }
    return (Result)EVar1;
  }
  __assert_fail("is_index()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/ir.h"
                ,0x36,"Index wabt::Var::index() const");
}

Assistant:

Result Validator::CheckVar(Index max_index,
                           const Var* var,
                           const char* desc,
                           Index* out_index) {
  if (var->index() < max_index) {
    if (out_index) {
      *out_index = var->index();
    }
    return Result::Ok;
  }
  PrintError(&var->loc, "%s variable out of range (max %" PRIindex ")", desc,
             max_index);
  return Result::Error;
}